

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall
ObjectTest_basic_get_multiset_Test::TestBody(ObjectTest_basic_get_multiset_Test *this)

{
  _Rb_tree_header *p_Var1;
  pointer *__ptr;
  object obj;
  AssertHelper local_d0 [8];
  char local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  _Rb_tree<bool,_bool,_std::_Identity<bool>,_std::less<bool>,_std::allocator<bool>_> local_b8;
  _Rb_tree<bool,_bool,_std::_Identity<bool>,_std::less<bool>,_std::allocator<bool>_> local_88;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_58;
  undefined1 local_28;
  
  local_58._M_first._M_storage = (_Uninitialized<void_*,_true>)(void *)0x0;
  local_28 = 0;
  p_Var1 = &local_88._M_impl.super__Rb_tree_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = (long *)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  jessilib::object::
  get<std::multiset<bool,_std::less<bool>,_std::allocator<bool>_>,_std::multiset<bool,_std::less<bool>,_std::allocator<bool>_>,_nullptr>
            ((multiset<bool,_std::less<bool>,_std::allocator<bool>_> *)&local_b8,
             (object *)&local_58._M_first,
             (multiset<bool,_std::less<bool>,_std::allocator<bool>_> *)&local_88);
  local_c8[0] = local_b8._M_impl.super__Rb_tree_header._M_node_count == 0;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::_Rb_tree<bool,_bool,_std::_Identity<bool>,_std::less<bool>,_std::allocator<bool>_>::~_Rb_tree
            (&local_b8);
  std::_Rb_tree<bool,_bool,_std::_Identity<bool>,_std::less<bool>,_std::allocator<bool>_>::~_Rb_tree
            (&local_88);
  if (local_c8[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_b8,local_c8,"obj.get<std::multiset<bool>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x11a,(char *)local_b8._M_impl._0_8_);
    testing::internal::AssertHelper::operator=(local_d0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    if ((_Base_ptr *)local_b8._M_impl._0_8_ !=
        &local_b8._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_b8._M_impl._0_8_,
                      (ulong)((long)&(local_b8._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    if ((long *)local_88._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = (long *)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  jessilib::object::
  get<std::multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>,_std::multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>,_nullptr>
            ((multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> *)
             &local_b8,(object *)&local_58._M_first,
             (multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> *)
             &local_88);
  local_c8[0] = local_b8._M_impl.super__Rb_tree_header._M_node_count == 0;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Rb_tree<signed_char,_signed_char,_std::_Identity<signed_char>,_std::less<signed_char>,_std::allocator<signed_char>_>
  ::~_Rb_tree((_Rb_tree<signed_char,_signed_char,_std::_Identity<signed_char>,_std::less<signed_char>,_std::allocator<signed_char>_>
               *)&local_b8);
  std::
  _Rb_tree<signed_char,_signed_char,_std::_Identity<signed_char>,_std::less<signed_char>,_std::allocator<signed_char>_>
  ::~_Rb_tree((_Rb_tree<signed_char,_signed_char,_std::_Identity<signed_char>,_std::less<signed_char>,_std::allocator<signed_char>_>
               *)&local_88);
  if (local_c8[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_b8,local_c8,"obj.get<std::multiset<signed char>>().empty()"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x11b,(char *)local_b8._M_impl._0_8_);
    testing::internal::AssertHelper::operator=(local_d0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    if ((_Base_ptr *)local_b8._M_impl._0_8_ !=
        &local_b8._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_b8._M_impl._0_8_,
                      (ulong)((long)&(local_b8._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    if ((long *)local_88._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = (long *)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  jessilib::object::
  get<std::multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>,_std::multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>,_nullptr>
            ((multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
             &local_b8,(object *)&local_58._M_first,
             (multiset<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
             &local_88);
  local_c8[0] = local_b8._M_impl.super__Rb_tree_header._M_node_count == 0;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
  ::~_Rb_tree((_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
               *)&local_b8);
  std::
  _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
  ::~_Rb_tree((_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
               *)&local_88);
  if (local_c8[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_b8,local_c8,
               "obj.get<std::multiset<unsigned char>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x11c,(char *)local_b8._M_impl._0_8_);
    testing::internal::AssertHelper::operator=(local_d0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    if ((_Base_ptr *)local_b8._M_impl._0_8_ !=
        &local_b8._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_b8._M_impl._0_8_,
                      (ulong)((long)&(local_b8._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    if ((long *)local_88._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = (long *)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  jessilib::object::
  get<std::multiset<short,_std::less<short>,_std::allocator<short>_>,_std::multiset<short,_std::less<short>,_std::allocator<short>_>,_nullptr>
            ((multiset<short,_std::less<short>,_std::allocator<short>_> *)&local_b8,
             (object *)&local_58._M_first,
             (multiset<short,_std::less<short>,_std::allocator<short>_> *)&local_88);
  local_c8[0] = local_b8._M_impl.super__Rb_tree_header._M_node_count == 0;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::_Rb_tree<short,_short,_std::_Identity<short>,_std::less<short>,_std::allocator<short>_>::
  ~_Rb_tree((_Rb_tree<short,_short,_std::_Identity<short>,_std::less<short>,_std::allocator<short>_>
             *)&local_b8);
  std::_Rb_tree<short,_short,_std::_Identity<short>,_std::less<short>,_std::allocator<short>_>::
  ~_Rb_tree((_Rb_tree<short,_short,_std::_Identity<short>,_std::less<short>,_std::allocator<short>_>
             *)&local_88);
  if (local_c8[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_b8,local_c8,"obj.get<std::multiset<short>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x11d,(char *)local_b8._M_impl._0_8_);
    testing::internal::AssertHelper::operator=(local_d0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    if ((_Base_ptr *)local_b8._M_impl._0_8_ !=
        &local_b8._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_b8._M_impl._0_8_,
                      (ulong)((long)&(local_b8._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    if ((long *)local_88._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = (long *)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  jessilib::object::
  get<std::multiset<int,_std::less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>,_nullptr>
            ((multiset<int,_std::less<int>,_std::allocator<int>_> *)&local_b8,
             (object *)&local_58._M_first,
             (multiset<int,_std::less<int>,_std::allocator<int>_> *)&local_88);
  local_c8[0] = local_b8._M_impl.super__Rb_tree_header._M_node_count == 0;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_b8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_88);
  if (local_c8[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_b8,local_c8,"obj.get<std::multiset<int>>().empty()","false"
              );
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x11e,(char *)local_b8._M_impl._0_8_);
    testing::internal::AssertHelper::operator=(local_d0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    if ((_Base_ptr *)local_b8._M_impl._0_8_ !=
        &local_b8._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_b8._M_impl._0_8_,
                      (ulong)((long)&(local_b8._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    if ((long *)local_88._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = (long *)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  jessilib::object::
  get<std::multiset<long,_std::less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>,_nullptr>
            ((multiset<long,_std::less<long>,_std::allocator<long>_> *)&local_b8,
             (object *)&local_58._M_first,
             (multiset<long,_std::less<long>,_std::allocator<long>_> *)&local_88);
  local_c8[0] = local_b8._M_impl.super__Rb_tree_header._M_node_count == 0;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *)
             &local_b8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *)
             &local_88);
  if (local_c8[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_b8,local_c8,"obj.get<std::multiset<long>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x11f,(char *)local_b8._M_impl._0_8_);
    testing::internal::AssertHelper::operator=(local_d0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    if ((_Base_ptr *)local_b8._M_impl._0_8_ !=
        &local_b8._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_b8._M_impl._0_8_,
                      (ulong)((long)&(local_b8._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    if ((long *)local_88._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = (long *)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  jessilib::object::
  get<std::multiset<long_long,_std::less<long_long>,_std::allocator<long_long>_>,_std::multiset<long_long,_std::less<long_long>,_std::allocator<long_long>_>,_nullptr>
            ((multiset<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)&local_b8,
             (object *)&local_58._M_first,
             (multiset<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)&local_88);
  local_c8[0] = local_b8._M_impl.super__Rb_tree_header._M_node_count == 0;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  ::~_Rb_tree((_Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
               *)&local_b8);
  std::
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  ::~_Rb_tree((_Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
               *)&local_88);
  if (local_c8[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_b8,local_c8,"obj.get<std::multiset<long long>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x120,(char *)local_b8._M_impl._0_8_);
    testing::internal::AssertHelper::operator=(local_d0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    if ((_Base_ptr *)local_b8._M_impl._0_8_ !=
        &local_b8._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_b8._M_impl._0_8_,
                      (ulong)((long)&(local_b8._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    if ((long *)local_88._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = (long *)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  jessilib::object::
  get<std::multiset<long,_std::less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>,_nullptr>
            ((multiset<long,_std::less<long>,_std::allocator<long>_> *)&local_b8,
             (object *)&local_58._M_first,
             (multiset<long,_std::less<long>,_std::allocator<long>_> *)&local_88);
  local_c8[0] = local_b8._M_impl.super__Rb_tree_header._M_node_count == 0;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *)
             &local_b8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *)
             &local_88);
  if (local_c8[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_b8,local_c8,"obj.get<std::multiset<intmax_t>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x121,(char *)local_b8._M_impl._0_8_);
    testing::internal::AssertHelper::operator=(local_d0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    if ((_Base_ptr *)local_b8._M_impl._0_8_ !=
        &local_b8._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_b8._M_impl._0_8_,
                      (ulong)((long)&(local_b8._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    if ((long *)local_88._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = (long *)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  jessilib::object::
  get<std::multiset<float,_std::less<float>,_std::allocator<float>_>,_std::multiset<float,_std::less<float>,_std::allocator<float>_>,_nullptr>
            ((multiset<float,_std::less<float>,_std::allocator<float>_> *)&local_b8,
             (object *)&local_58._M_first,
             (multiset<float,_std::less<float>,_std::allocator<float>_> *)&local_88);
  local_c8[0] = local_b8._M_impl.super__Rb_tree_header._M_node_count == 0;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>::
  ~_Rb_tree((_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>
             *)&local_b8);
  std::_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>::
  ~_Rb_tree((_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>
             *)&local_88);
  if (local_c8[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_b8,local_c8,"obj.get<std::multiset<float>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x122,(char *)local_b8._M_impl._0_8_);
    testing::internal::AssertHelper::operator=(local_d0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    if ((_Base_ptr *)local_b8._M_impl._0_8_ !=
        &local_b8._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_b8._M_impl._0_8_,
                      (ulong)((long)&(local_b8._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    if ((long *)local_88._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = (long *)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  jessilib::object::
  get<std::multiset<double,_std::less<double>,_std::allocator<double>_>,_std::multiset<double,_std::less<double>,_std::allocator<double>_>,_nullptr>
            ((multiset<double,_std::less<double>,_std::allocator<double>_> *)&local_b8,
             (object *)&local_58._M_first,
             (multiset<double,_std::less<double>,_std::allocator<double>_> *)&local_88);
  local_c8[0] = local_b8._M_impl.super__Rb_tree_header._M_node_count == 0;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
  ::~_Rb_tree((_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
               *)&local_b8);
  std::_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
  ::~_Rb_tree((_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
               *)&local_88);
  if (local_c8[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_b8,local_c8,"obj.get<std::multiset<double>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x123,(char *)local_b8._M_impl._0_8_);
    testing::internal::AssertHelper::operator=(local_d0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    if ((_Base_ptr *)local_b8._M_impl._0_8_ !=
        &local_b8._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_b8._M_impl._0_8_,
                      (ulong)((long)&(local_b8._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    if ((long *)local_88._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = (long *)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  jessilib::object::
  get<std::multiset<long_double,_std::less<long_double>,_std::allocator<long_double>_>,_std::multiset<long_double,_std::less<long_double>,_std::allocator<long_double>_>,_nullptr>
            ((multiset<long_double,_std::less<long_double>,_std::allocator<long_double>_> *)
             &local_b8,(object *)&local_58._M_first,
             (multiset<long_double,_std::less<long_double>,_std::allocator<long_double>_> *)
             &local_88);
  local_c8[0] = local_b8._M_impl.super__Rb_tree_header._M_node_count == 0;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Rb_tree<long_double,_long_double,_std::_Identity<long_double>,_std::less<long_double>,_std::allocator<long_double>_>
  ::~_Rb_tree((_Rb_tree<long_double,_long_double,_std::_Identity<long_double>,_std::less<long_double>,_std::allocator<long_double>_>
               *)&local_b8);
  std::
  _Rb_tree<long_double,_long_double,_std::_Identity<long_double>,_std::less<long_double>,_std::allocator<long_double>_>
  ::~_Rb_tree((_Rb_tree<long_double,_long_double,_std::_Identity<long_double>,_std::less<long_double>,_std::allocator<long_double>_>
               *)&local_88);
  if (local_c8[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_b8,local_c8,"obj.get<std::multiset<long double>>().empty()"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x124,(char *)local_b8._M_impl._0_8_);
    testing::internal::AssertHelper::operator=(local_d0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    if ((_Base_ptr *)local_b8._M_impl._0_8_ !=
        &local_b8._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_b8._M_impl._0_8_,
                      (ulong)((long)&(local_b8._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    if ((long *)local_88._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = (long *)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  jessilib::object::
  get<std::multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_b8,(object *)&local_58._M_first,
             (multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_88);
  local_c8[0] = local_b8._M_impl.super__Rb_tree_header._M_node_count == 0;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::_Identity<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::_Identity<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
               *)&local_b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::_Identity<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::_Identity<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
               *)&local_88);
  if (local_c8[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_b8,local_c8,
               "obj.get<std::multiset<std::u8string>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x125,(char *)local_b8._M_impl._0_8_);
    testing::internal::AssertHelper::operator=(local_d0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    if ((_Base_ptr *)local_b8._M_impl._0_8_ !=
        &local_b8._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_b8._M_impl._0_8_,
                      (ulong)((long)&(local_b8._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    if ((long *)local_88._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = (long *)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  jessilib::object::
  get<std::multiset<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>,_std::multiset<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>,_nullptr>
            ((multiset<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
              *)&local_b8,(object *)&local_58._M_first,
             (multiset<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
              *)&local_88);
  local_c8[0] = local_b8._M_impl.super__Rb_tree_header._M_node_count == 0;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Rb_tree<jessilib::object,_jessilib::object,_std::_Identity<jessilib::object>,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
  ::~_Rb_tree((_Rb_tree<jessilib::object,_jessilib::object,_std::_Identity<jessilib::object>,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
               *)&local_b8);
  std::
  _Rb_tree<jessilib::object,_jessilib::object,_std::_Identity<jessilib::object>,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
  ::~_Rb_tree((_Rb_tree<jessilib::object,_jessilib::object,_std::_Identity<jessilib::object>,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
               *)&local_88);
  if (local_b8._M_impl.super__Rb_tree_header._M_node_count != 0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_b8,local_c8,"obj.get<std::multiset<object>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x126,(char *)local_b8._M_impl._0_8_);
    testing::internal::AssertHelper::operator=(local_d0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    if ((_Base_ptr *)local_b8._M_impl._0_8_ !=
        &local_b8._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_b8._M_impl._0_8_,
                      (ulong)((long)&(local_b8._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    if ((long *)local_88._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_58._M_first);
  return;
}

Assistant:

TEST(ObjectTest, basic_get_multiset) {
	object obj;

	EXPECT_TRUE(obj.get<std::multiset<bool>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<signed char>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<unsigned char>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<short>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<int>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<long>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<long long>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<intmax_t>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<float>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<double>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<long double>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<std::u8string>>().empty());
	EXPECT_TRUE(obj.get<std::multiset<object>>().empty());
}